

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::setBitsSlowCase(APInt *this,uint loBit,uint hiBit)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = loBit >> 6;
  uVar1 = hiBit >> 6;
  uVar3 = -1L << ((byte)loBit & 0x3f);
  if ((hiBit & 0x3f) != 0) {
    uVar4 = 0xffffffffffffffff >> (-(char)(hiBit & 0x3f) & 0x3fU);
    if (uVar1 == uVar2) {
      uVar3 = uVar3 & uVar4;
    }
    else {
      (this->U).pVal[uVar1] = (this->U).pVal[uVar1] | uVar4;
    }
  }
  (this->U).pVal[uVar2] = (this->U).pVal[uVar2] | uVar3;
  uVar3 = (ulong)(uVar2 + 1);
  if (uVar2 + 1 < uVar1) {
    do {
      (this->U).pVal[uVar3] = 0xffffffffffffffff;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void APInt::setBitsSlowCase(unsigned loBit, unsigned hiBit) {
  unsigned loWord = whichWord(loBit);
  unsigned hiWord = whichWord(hiBit);

  // Create an initial mask for the low word with zeros below loBit.
  uint64_t loMask = WORD_MAX << whichBit(loBit);

  // If hiBit is not aligned, we need a high mask.
  unsigned hiShiftAmt = whichBit(hiBit);
  if (hiShiftAmt != 0) {
    // Create a high mask with zeros above hiBit.
    uint64_t hiMask = WORD_MAX >> (APINT_BITS_PER_WORD - hiShiftAmt);
    // If loWord and hiWord are equal, then we combine the masks. Otherwise,
    // set the bits in hiWord.
    if (hiWord == loWord)
      loMask &= hiMask;
    else
      U.pVal[hiWord] |= hiMask;
  }
  // Apply the mask to the low word.
  U.pVal[loWord] |= loMask;

  // Fill any words between loWord and hiWord with all ones.
  for (unsigned word = loWord + 1; word < hiWord; ++word)
    U.pVal[word] = WORD_MAX;
}